

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

Vartype __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::ConvertVartype
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this,string *vartype)

{
  bool bVar1;
  Vartype VVar2;
  runtime_error *this_00;
  
  bVar1 = std::operator==(vartype,"SPIN");
  VVar2 = SPIN;
  if (!bVar1) {
    bVar1 = std::operator==(vartype,"BINARY");
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unknown vartype detected");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    VVar2 = BINARY;
  }
  return VVar2;
}

Assistant:

cimod::Vartype ConvertVartype(const std::string vartype) const {
    if (vartype == "SPIN") {
      return cimod::Vartype::SPIN;
    } else if (vartype == "BINARY") {
      return cimod::Vartype::BINARY;
    } else {
      throw std::runtime_error("Unknown vartype detected");
    }
  }